

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatWriter.cpp
# Opt level: O0

void __thiscall OpenMD::StatWriter::writeReal(StatWriter *this,int i)

{
  uint uVar1;
  ostream *this_00;
  undefined8 uVar2;
  ostream *in_RDI;
  RealType __value;
  RealType s;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  Stats *in_stack_ffffffffffffffd0;
  
  __value = Stats::getRealData(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  uVar1 = std::isinf(__value);
  if (((uVar1 & 1) == 0) && (uVar1 = std::isnan(__value), (uVar1 & 1) == 0)) {
    this_00 = std::operator<<(in_RDI,"\t");
    std::ostream::operator<<(this_00,__value);
    return;
  }
  Stats::getTitle_abi_cxx11_
            ((Stats *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             (int)((ulong)in_RDI >> 0x20));
  uVar2 = std::__cxx11::string::c_str();
  snprintf(painCave.errMsg,2000,"StatWriter detected a numerical error writing: %s ",uVar2);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  painCave.isFatal = 1;
  simError();
  return;
}

Assistant:

void StatWriter::writeReal(int i) {
    RealType s = stats_->getRealData(i);

    if (!std::isinf(s) && !std::isnan(s)) {
      statfile_ << "\t" << s;
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "StatWriter detected a numerical error writing: %s ",
               stats_->getTitle(i).c_str());
      painCave.isFatal = 1;
      simError();
    }
  }